

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result wabt::interp::Match(GlobalType *expected,GlobalType *actual,string *out_msg)

{
  Mutability MVar1;
  int iVar2;
  int iVar3;
  Enum EVar4;
  char *pcVar5;
  char *pcVar6;
  char *format;
  string sStack_38;
  
  MVar1 = actual->mut;
  if (MVar1 == expected->mut) {
    iVar2 = *(int *)&(actual->super_ExternType).field_0xc;
    iVar3 = *(int *)&(expected->super_ExternType).field_0xc;
    EVar4 = Ok;
    if (iVar2 == iVar3) {
      return (Result)Ok;
    }
    if (MVar1 != Var) {
      switch(iVar3) {
      case -0x18:
      case -0x12:
      case -0x10:
switchD_0024bd35_caseD_ffffffe8:
        if (iVar2 == -0x12) {
          return (Result)Ok;
        }
        break;
      case -0x17:
      case -0x16:
      case -0x15:
      case -0x14:
      case -0x13:
        break;
      case -0x11:
        goto switchD_0024bd35_caseD_ffffffef;
      default:
        if (iVar3 == 2) goto switchD_0024bd35_caseD_ffffffe8;
      }
    }
    pcVar5 = GetName((ValueType)0x0);
    pcVar6 = GetName((ValueType)0x0);
    format = "type mismatch in imported global, expected %s but got %s.";
  }
  else {
    pcVar5 = GetName::kNames[(int)MVar1];
    pcVar6 = GetName::kNames[(int)expected->mut];
    format = "mutability mismatch in imported global, expected %s but got %s.";
  }
  StringPrintf_abi_cxx11_(&sStack_38,format,pcVar5,pcVar6);
  std::__cxx11::string::operator=((string *)out_msg,(string *)&sStack_38);
  std::__cxx11::string::_M_dispose();
  EVar4 = Error;
switchD_0024bd35_caseD_ffffffef:
  return (Result)EVar4;
}

Assistant:

Result Match(const GlobalType& expected,
             const GlobalType& actual,
             std::string* out_msg) {
  if (actual.mut != expected.mut) {
    *out_msg = StringPrintf(
        "mutability mismatch in imported global, expected %s but got %s.",
        GetName(actual.mut), GetName(expected.mut));
    return Result::Error;
  }

  if (actual.type != expected.type &&
      (expected.mut == Mutability::Var ||
       !TypesMatch(expected.type, actual.type))) {
    *out_msg = StringPrintf(
        "type mismatch in imported global, expected %s but got %s.",
        GetName(expected.type), GetName(actual.type));
    return Result::Error;
  }

  return Result::Ok;
}